

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool GlobOpt::DoArrayLengthHoist(Func *func)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *pJVar2;
  FunctionJITTimeInfo *this;
  JITTimeProfileInfo *this_00;
  
  bVar1 = DoArrayCheckHoist(func);
  if (bVar1) {
    pJVar2 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar2);
    this = JITTimeWorkItem::GetJITTimeInfo(func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,ArrayLengthHoistPhase,sourceContextId,functionId);
    if (!bVar1) {
      pJVar2 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
      bVar1 = JITTimeFunctionBody::HasProfileInfo(pJVar2);
      if (!bVar1) {
        return true;
      }
      pJVar2 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
      this_00 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar2);
      bVar1 = JITTimeWorkItem::IsLoopBody(func->m_workItem);
      bVar1 = JITTimeProfileInfo::IsArrayLengthHoistDisabled(this_00,bVar1);
      return !bVar1;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::DoArrayLengthHoist(Func const * const func)
{
    return
        DoArrayCheckHoist(func) &&
        !PHASE_OFF(Js::Phase::ArrayLengthHoistPhase, func) &&
        (!func->HasProfileInfo() || !func->GetReadOnlyProfileInfo()->IsArrayLengthHoistDisabled(func->IsLoopBody()));
}